

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O2

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CMainMethod *stm)

{
  string *psVar1;
  CType *pCVar2;
  CIdExp *pCVar3;
  CFieldList *pCVar4;
  CCompoundStm *pCVar5;
  
  pCVar2 = (stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  if (pCVar2 != (CType *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
  }
  psVar1 = &this->code;
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  pCVar3 = (stm->args)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar3 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar3->super_IExpression).super_PositionedNode)(pCVar3,this);
  }
  std::__cxx11::string::append((char *)psVar1);
  pCVar4 = (stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t
           .super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar4 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  }
  pCVar5 = (stm->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  if (pCVar5 != (CCompoundStm *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar5->super_IStatement).super_PositionedNode)(pCVar5,this);
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

void CConvertVisitor::Visit(CMainMethod &stm) {
	if (stm.returnType) {
		stm.returnType->Accept(*this);
	}
	this->code += "public static void main";
	this->code += "(String[] ";
	if (stm.args) {
		stm.args->Accept(*this);
	}
	this->code += ") {\n";
	if (stm.vars) {
		stm.vars->Accept(*this);
	}
	if (stm.statements) {
		stm.statements->Accept(*this);
	}
	this->code += "}\n\n";
}